

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.c
# Opt level: O1

void * object_getIndexedIvars(id obj)

{
  uintptr_t addr;
  ulong uVar1;
  id poVar2;
  ulong uVar3;
  
  if (obj != (id)0x0) {
    uVar1 = (ulong)obj & 7;
    poVar2 = obj;
    if (uVar1 != 0) {
      poVar2 = (id)((long)SmallObjectClasses + (ulong)(uint)((int)uVar1 * 8));
    }
    uVar3 = poVar2->isa->instance_size;
    if (uVar3 == 0) {
      poVar2 = obj;
      if (uVar1 != 0) {
        poVar2 = (id)((long)SmallObjectClasses + (ulong)(uint)((int)uVar1 << 3));
      }
      if (poVar2->isa == (Class)0x0) {
        uVar3 = 0;
      }
      else {
        uVar3 = (ulong)(-((uint)poVar2->isa->info & 1) & 0x88);
      }
    }
    return (void *)((long)&obj->isa + uVar3);
  }
  return (void *)0x0;
}

Assistant:

void *object_getIndexedIvars(id obj)
{
	CHECK_ARG(obj);
	size_t size = classForObject(obj)->instance_size;
	if ((0 == size) && class_isMetaClass(classForObject(obj)))
	{
		size = sizeof(struct objc_class);
	}
	return ((char*)obj) + size;
}